

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O2

bool __thiscall
absl::numbers_internal::safe_strto32_base
          (numbers_internal *this,string_view text,Nonnull<int32_t_*> value,int base)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool local_25;
  uint local_24;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = (char *)text._M_len;
  local_24 = (uint)value;
  *(int *)text._M_str = 0;
  local_20._M_len = (size_t)this;
  bVar1 = anon_unknown_0::safe_parse_sign_and_base(&local_20,(Nonnull<int_*>)&local_24,&local_25);
  if (bVar1) {
    if (local_25 == false) {
      if ((int)local_24 < 0) {
        __assert_fail("base >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0x3da,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = int]"
                     );
      }
      if ((1 < local_24) &&
         ((int)(0x7fffffff / (ulong)local_24) !=
          *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + (ulong)local_24 * 4)))
      {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0x3df,
                      "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = int]"
                     );
      }
      local_20._M_len = local_20._M_len + (long)local_20._M_str;
      for (iVar3 = 0;
          (((bVar1 = local_20._M_len <= local_20._M_str, iVar2 = iVar3, !bVar1 &&
            (uVar4 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_20._M_str],
            (int)uVar4 < (int)local_24)) &&
           (iVar2 = 0x7fffffff,
           iVar3 <= *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase +
                            (ulong)local_24 * 4))) &&
          ((int)(iVar3 * local_24) <= (int)(uVar4 ^ 0x7fffffff))); iVar3 = iVar3 * local_24 + uVar4)
      {
        local_20._M_str = (char *)((numbers_internal *)local_20._M_str + 1);
      }
    }
    else {
      if ((1 < (int)local_24) &&
         ((int)(0x80000000 / (ulong)local_24) +
          *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase + (long)(int)local_24 * 4
                  ) != 0)) {
        __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0x402,
                      "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = int]"
                     );
      }
      local_20._M_len = local_20._M_len + (long)local_20._M_str;
      for (iVar3 = 0;
          ((bVar1 = local_20._M_len <= local_20._M_str, iVar2 = iVar3, !bVar1 &&
           (uVar4 = (uint)(char)(anonymous_namespace)::kAsciiToInt[(byte)*local_20._M_str],
           (int)uVar4 < (int)local_24)) &&
          ((iVar2 = -0x80000000,
           *(int *)((anonymous_namespace)::LookupTables<int>::kVminOverBase +
                   (long)(int)local_24 * 4) <= iVar3 &&
           ((int)(uVar4 | 0x80000000) <= (int)(iVar3 * local_24)))));
          iVar3 = iVar3 * local_24 - uVar4) {
        local_20._M_str = (char *)((numbers_internal *)local_20._M_str + 1);
      }
    }
    *(int *)text._M_str = iVar2;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool safe_strto32_base(absl::string_view text, absl::Nonnull<int32_t*> value,
                       int base) {
  return safe_int_internal<int32_t>(text, value, base);
}